

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void __thiscall BailOutRecord::DumpValue(BailOutRecord *this,int offset,bool isFloat64)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  char16_t *form;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)offset;
  if (offset < 0) {
    Output::Print(L"Stack offset %6d",uVar6);
    return;
  }
  if (offset == 0) {
    form = L"Not live";
  }
  else {
    uVar3 = GetBailOutRegisterSaveSlotCount();
    if ((uint)offset <= uVar3) {
      Output::Print(L"Register %-4S  %4d",RegNames[uVar6],uVar6);
      return;
    }
    uVar3 = GetBailOutRegisterSaveSlotCount();
    uVar4 = GetBailOutReserveSlotCount();
    if (uVar4 + uVar3 != offset) {
      uVar3 = GetBailOutRegisterSaveSlotCount();
      uVar4 = GetBailOutReserveSlotCount();
      uVar6 = (ulong)(~(uVar3 + uVar4) + offset);
      Output::Print(L"Constant index %4d value:0x%p (Var)",uVar6,this->constants[uVar6]);
      if (isFloat64) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x24e,"(!isFloat64)","!isFloat64");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      return;
    }
    form = L"Arguments object";
  }
  Output::Print(form);
  return;
}

Assistant:

void BailOutRecord::DumpValue(int offset, bool isFloat64)
{
    if (offset < 0)
    {
        Output::Print(_u("Stack offset %6d"),  offset);
    }
    else if (offset > 0)
    {
        if ((uint)offset <= GetBailOutRegisterSaveSlotCount())
        {
            if (isFloat64)
            {
#ifdef _M_ARM
                Output::Print(_u("Register %-4S  %4d"), RegNames[(offset - RegD0) / 2  + RegD0], offset);
#else
                Output::Print(_u("Register %-4S  %4d"), RegNames[offset], offset);
#endif
            }
            else
            {
                Output::Print(_u("Register %-4S  %4d"), RegNames[offset], offset);
            }
        }
        else if (BailOutRecord::IsArgumentsObject((uint)offset))
        {
            Output::Print(_u("Arguments object"));
        }
        else
        {
            // Constants offset starts from max bail out register save slot count
            uint constantIndex = offset - (GetBailOutRegisterSaveSlotCount() + GetBailOutReserveSlotCount()) - 1;
            Output::Print(_u("Constant index %4d value:0x%p (Var)"), constantIndex, this->constants[constantIndex]);
            Assert(!isFloat64);
        }
    }
    else
    {
        Output::Print(_u("Not live"));
    }
}